

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O3

void __thiscall Noise::Noise(Noise *this,Noise *noise)

{
  Time *time;
  string local_60;
  string local_40;
  
  time = (noise->super_StochasticVariable).super_StochasticProcess.super_TimeDependent.xTime;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Stochastic Variable","");
  StochasticProcess::StochasticProcess((StochasticProcess *)this,time,&local_40,&local_60);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__StochasticProcess_0015d338;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__StochasticVariable_0015d3c0;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__StochasticVariable_0015d408;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__WienerNoise_0015cd50;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Noise_0015ce00;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Noise_0015ce48;
  return;
}

Assistant:

Noise::Noise( const Noise &noise)
	: StochasticVariable(noise.xTime)
{}